

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Errors.h
# Opt level: O1

CompileMessage * __thiscall
soul::CompileMessageHelpers::createMessage<char_const(&)[2]>
          (CompileMessage *__return_storage_ptr__,CompileMessageHelpers *this,Category category,
          CodeLocation *location,Type type,char *text,char (*args) [2])

{
  SourceCodeText *pSVar1;
  CompileMessage *pCVar2;
  size_t sVar3;
  undefined4 in_register_00000014;
  undefined4 in_register_00000084;
  size_t index;
  long lVar4;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  stringArgs;
  string result;
  allocator_type local_101;
  Category local_100;
  Type local_fc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d8;
  long *local_c0;
  long local_b8;
  long local_b0 [2];
  long *local_a0;
  CompileMessage *local_98;
  long *local_90;
  long local_88;
  long local_80 [2];
  string local_70;
  string local_50;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,(char *)CONCAT44(in_register_00000084,type),
             (allocator<char> *)&local_f8);
  local_90 = local_80;
  sVar3 = strlen(text);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,text,text + sVar3);
  local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_f8,local_90,local_88 + (long)local_90);
  __l._M_len = 1;
  __l._M_array = &local_f8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_d8,__l,&local_101);
  local_98 = __return_storage_ptr__;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  local_100 = (Category)this;
  local_fc = (Type)location;
  local_a0 = (long *)CONCAT44(in_register_00000014,category);
  if (local_90 != local_80) {
    operator_delete(local_90,local_80[0] + 1);
  }
  if (local_d8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_d8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    lVar4 = 0;
    index = 0;
    do {
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,local_c0,local_b8 + (long)local_c0);
      replaceArgument(&local_f8,&local_50,index,
                      (string *)
                      ((long)&((local_d8.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                      lVar4));
      std::__cxx11::string::operator=((string *)&local_c0,(string *)&local_f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      index = index + 1;
      lVar4 = lVar4 + 0x20;
    } while (index < (ulong)((long)local_d8.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_d8.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_70,local_c0,local_b8 + (long)local_c0);
  pCVar2 = local_98;
  choc::text::trim(&local_98->description,&local_70);
  pSVar1 = (SourceCodeText *)*local_a0;
  (pCVar2->location).sourceCode.object = pSVar1;
  if (pSVar1 != (SourceCodeText *)0x0) {
    (pSVar1->super_RefCountedObject).refCount = (pSVar1->super_RefCountedObject).refCount + 1;
  }
  (pCVar2->location).location.data = (char *)local_a0[1];
  pCVar2->type = local_fc;
  pCVar2->category = local_100;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_d8);
  if (local_c0 != local_b0) {
    operator_delete(local_c0,local_b0[0] + 1);
  }
  return pCVar2;
}

Assistant:

static CompileMessage createMessage (CompileMessage::Category category, CodeLocation location,
                                         CompileMessage::Type type, const char* text, Args&&... args)
    {
        std::string result (text);
        std::vector<std::string> stringArgs { convertToString (args)... };

        for (size_t i = 0; i < stringArgs.size(); ++i)
            result = replaceArgument (result, i, stringArgs[i]);

        return CompileMessage { choc::text::trim (result), location, type, category };
    }